

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char **__argv;
  char *__path;
  int iVar1;
  int *piVar2;
  UnitTest *this;
  char **__envp;
  long in_FS_OFFSET;
  bool bVar3;
  allocator local_2ca;
  allocator local_2c9;
  char *local_2c8;
  char *original_dir;
  allocator local_2ad;
  int local_2ac;
  undefined8 *puStack_2a8;
  int gtest_retval;
  ExecDeathTestArgs *args;
  void *child_arg_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  puStack_2a8 = (undefined8 *)child_arg;
  args = (ExecDeathTestArgs *)child_arg;
  do {
    do {
      local_2ac = close(*(int *)(puStack_2a8 + 1));
      bVar3 = false;
      if (local_2ac == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_2ac == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"CHECK failed: File ",&local_2ad);
      std::operator+(&local_d0,&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/googletest/src/gtest-all.cc"
                    );
      std::operator+(&local_b0,&local_d0,", line ");
      original_dir._0_4_ = 0x1d79;
      StreamableToString<int>(&local_110,(int *)&original_dir);
      std::operator+(&local_90,&local_b0,&local_110);
      std::operator+(&local_70,&local_90,": ");
      std::operator+(&local_50,&local_70,"close(args->close_fd)");
      std::operator+(&local_30,&local_50," != -1");
      DeathTestAbort(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2ad);
    }
    bVar3 = AlwaysFalse();
  } while (bVar3);
  this = UnitTest::GetInstance();
  local_2c8 = UnitTest::original_working_dir(this);
  iVar1 = chdir(local_2c8);
  if (iVar1 == 0) {
    __argv = (char **)*puStack_2a8;
    __path = *__argv;
    __envp = GetEnviron();
    execve(__path,__argv,__envp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"execve(",&local_2ca);
    std::operator+(&local_250,&local_270,*(char **)*puStack_2a8);
    std::operator+(&local_230,&local_250,", ...) in ");
    std::operator+(&local_210,&local_230,local_2c8);
    std::operator+(&local_1f0,&local_210," failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_1d0,&local_1f0,&local_290);
    DeathTestAbort(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ca);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"chdir(\"",&local_2c9);
    std::operator+(&local_170,&local_190,local_2c8);
    std::operator+(&local_150,&local_170,"\") failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_130,&local_150,&local_1b0);
    DeathTestAbort(&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  }
  child_arg_local._4_4_ = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return 1;
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
			ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
			GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

			// We need to execute the test program in the same environment where
			// it was originally invoked.  Therefore we change to the original
			// working directory first.
			const char* const original_dir =
				UnitTest::GetInstance()->original_working_dir();
			// We can safely call chdir() as it's a direct system call.
			if (chdir(original_dir) != 0) {
				DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
					GetLastErrnoDescription());
				return EXIT_FAILURE;
			}

			// We can safely call execve() as it's a direct system call.  We
			// cannot use execvp() as it's a libc function and thus potentially
			// unsafe.  Since execve() doesn't search the PATH, the user must
			// invoke the test program via a valid path that contains at least
			// one path separator.
			execve(args->argv[0], args->argv, GetEnviron());
			DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
				original_dir + " failed: " +
				GetLastErrnoDescription());
			return EXIT_FAILURE;
		}